

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O1

uint32_t setChannelFlags(uint32_t channel,VkSuffix suffix)

{
  switch(suffix) {
  case s_SNORM:
  case s_SSCALED:
  case s_SINT:
  case s_SFIXED5:
    channel = channel | 0x40;
    break;
  case s_SFLOAT:
    return channel | 0xc0;
  case s_UFLOAT:
    return channel | 0x80;
  case s_SRGB:
    if (channel == 0xf) {
      channel = 0x1f;
    }
    return channel;
  }
  return channel;
}

Assistant:

static uint32_t setChannelFlags(uint32_t channel, enum VkSuffix suffix)
{
    switch (suffix) {
    case s_UNORM: break;
    case s_SNORM:
        channel |=
            KHR_DF_SAMPLE_DATATYPE_SIGNED;
        break;
    case s_USCALED: break;
    case s_SSCALED:
        channel |=
            KHR_DF_SAMPLE_DATATYPE_SIGNED;
        break;
    case s_UINT: break;
    case s_SINT:
        channel |=
            KHR_DF_SAMPLE_DATATYPE_SIGNED;
        break;
    case s_SFLOAT:
        channel |=
            KHR_DF_SAMPLE_DATATYPE_FLOAT |
            KHR_DF_SAMPLE_DATATYPE_SIGNED;
        break;
    case s_UFLOAT:
        channel |=
            KHR_DF_SAMPLE_DATATYPE_FLOAT;
        break;
    case s_SRGB:
        if (channel == KHR_DF_CHANNEL_RGBSDA_ALPHA) {
            channel |= KHR_DF_SAMPLE_DATATYPE_LINEAR;
        }
        break;
    case s_SFIXED5:
        channel |=
            KHR_DF_SAMPLE_DATATYPE_SIGNED;
        break;
    }
    return channel;
}